

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O3

xmlNodePtr
xmlXIncludeCopyXPointer
          (xmlXIncludeCtxtPtr ctxt,xmlDocPtr target,xmlDocPtr source,xmlXPathObjectPtr obj)

{
  xmlXPathObjectType xVar1;
  xmlElementType xVar2;
  int *piVar3;
  bool bVar4;
  xmlNodePtr pxVar5;
  xmlNodePtr pxVar6;
  _xmlNode *p_Var7;
  xmlNodePtr pxVar8;
  xmlDocPtr pxVar9;
  xmlNodePtr elem;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  xmlChar *pxVar16;
  uint uVar17;
  _xmlNode *node;
  xmlNodePtr pxVar18;
  int local_74;
  xmlDocPtr local_70;
  ulong local_68;
  int local_5c;
  xmlNodePtr local_58;
  xmlNodePtr local_50;
  uint local_44;
  xmlNodePtr local_40;
  xmlDocPtr local_38;
  
  local_70 = source;
  if (source == (xmlDocPtr)0x0) {
    local_70 = ctxt->doc;
  }
  if (obj == (xmlXPathObjectPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  if (target == (xmlDocPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  if (local_70 == (xmlDocPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  xVar1 = obj->type;
  local_38 = target;
  if (xVar1 == XPATH_LOCATIONSET) {
    piVar3 = (int *)obj->user;
    if ((piVar3 != (int *)0x0) && (0 < *piVar3)) {
      lVar14 = 0;
      pxVar8 = (xmlNodePtr)0x0;
      pxVar18 = (xmlNodePtr)0x0;
      do {
        p_Var7 = xmlXIncludeCopyXPointer
                           (ctxt,local_38,local_70,
                            *(xmlXPathObjectPtr *)(*(long *)(piVar3 + 2) + lVar14 * 8));
        if (pxVar18 == (xmlNodePtr)0x0) {
          pxVar8 = p_Var7;
          if (p_Var7 != (xmlNodePtr)0x0) goto LAB_0019b874;
          pxVar8 = (xmlNodePtr)0x0;
          pxVar18 = (xmlNodePtr)0x0;
        }
        else {
          xmlAddNextSibling(pxVar18,p_Var7);
          p_Var7 = pxVar18;
LAB_0019b874:
          do {
            pxVar18 = p_Var7;
            p_Var7 = pxVar18->next;
          } while (pxVar18->next != (_xmlNode *)0x0);
        }
        lVar14 = lVar14 + 1;
        if (*piVar3 <= lVar14) {
          return pxVar8;
        }
      } while( true );
    }
  }
  else if (xVar1 == XPATH_RANGE) {
    local_74 = 0;
    pxVar8 = (xmlNodePtr)obj->user;
    if ((pxVar8 != (xmlNodePtr)0x0) && (pxVar8->type != XML_NAMESPACE_DECL)) {
      pxVar9 = (xmlDocPtr)obj->user2;
      if (pxVar9 == (xmlDocPtr)0x0) {
        pxVar8 = xmlDocCopyNode(pxVar8,target,1);
        return pxVar8;
      }
      if (((xmlNodePtr)pxVar9)->type != XML_NAMESPACE_DECL) {
        local_68 = (ulong)(uint)obj->index;
        local_5c = obj->index2;
        local_44 = (uint)CONCAT71((uint7)(uint3)((uint)local_5c >> 8),1);
        iVar15 = 0;
        iVar12 = 0;
        pxVar18 = (xmlNodePtr)0x0;
        node = (_xmlNode *)0x0;
        p_Var7 = (xmlNodePtr)0x0;
        local_50 = pxVar8;
        do {
          local_40 = (xmlNodePtr)CONCAT44(local_40._4_4_,iVar15);
          local_70 = pxVar9;
          while( true ) {
            iVar13 = iVar12;
            if (local_74 < 0) {
              do {
                local_58 = pxVar8;
                p_Var7 = xmlDocCopyNode(node,target,2);
                xmlAddChild(p_Var7,pxVar18);
                node = node->parent;
                iVar12 = local_74 + 1;
                bVar4 = local_74 < -1;
                pxVar18 = p_Var7;
                local_74 = iVar12;
                pxVar8 = local_58;
              } while (bVar4);
              iVar13 = 0;
            }
            else {
              for (; local_74 < iVar12; iVar12 = iVar12 + -1) {
                p_Var7 = p_Var7->parent;
                iVar13 = local_74;
              }
            }
            iVar15 = local_74;
            iVar11 = (int)local_68;
            iVar12 = iVar13;
            if ((xmlDocPtr)pxVar8 == local_70) break;
            xVar2 = pxVar8->type;
            if (pxVar8 == local_50) {
              if (xVar2 - XML_TEXT_NODE < 2) {
                pxVar16 = pxVar8->content;
                if (pxVar16 == (xmlChar *)0x0) {
                  p_Var7 = xmlNewTextLen((xmlChar *)0x0,0);
                }
                else {
                  uVar10 = local_68 & 0xffffffff;
                  local_68 = local_68 & 0xffffffff;
                  if (1 < iVar11) {
                    local_68 = 0;
                    pxVar16 = pxVar16 + (uVar10 - 1);
                  }
                  p_Var7 = xmlNewText(pxVar16);
                }
                node = pxVar8->parent;
                pxVar18 = p_Var7;
                goto LAB_0019b714;
              }
              p_Var7 = xmlDocCopyNode(pxVar8,target,2);
              node = pxVar8->parent;
              pxVar18 = p_Var7;
              if ((int)local_68 < 2) goto LAB_0019b714;
              pxVar8 = xmlXIncludeGetNthChild(pxVar8,(int)local_68 + -1);
              local_74 = 1;
              local_68 = 0;
              iVar12 = 1;
            }
            else {
              if (((XML_XINCLUDE_END < xVar2) ||
                  ((0x1bc044U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) &&
                 (pxVar6 = xmlDocCopyNode(pxVar8,target,2), pxVar6 != (xmlNodePtr)0x0)) {
                if (local_74 == iVar13) {
                  xmlAddNextSibling(p_Var7,pxVar6);
                  p_Var7 = pxVar6;
                }
                else {
                  xmlAddChild(p_Var7,pxVar6);
                  p_Var7 = pxVar6;
                  iVar12 = local_74;
                }
              }
LAB_0019b714:
              pxVar8 = xmlXPtrAdvanceNode(pxVar8,&local_74);
              if ((int)local_40 <= local_74 && (local_44 & 1) == 0) {
                return pxVar18;
              }
            }
            if (pxVar8 == (xmlNodePtr)0x0) {
              return pxVar18;
            }
          }
          if (pxVar8->type == XML_TEXT_NODE) {
            if (pxVar8->content == (xmlChar *)0x0) {
              pxVar16 = (xmlChar *)0x0;
              iVar12 = 0;
            }
            else {
              uVar17 = iVar11 - 1;
              uVar10 = (ulong)uVar17;
              if (local_70 != (xmlDocPtr)local_50 || iVar11 < 2) {
                uVar17 = 0;
                uVar10 = 0;
              }
              pxVar16 = pxVar8->content + uVar10;
              iVar12 = local_5c - uVar17;
            }
            pxVar8 = xmlNewTextLen(pxVar16,iVar12);
            if (pxVar18 == (xmlNodePtr)0x0) {
              return pxVar8;
            }
            if (local_74 == iVar13) {
              xmlAddNextSibling(p_Var7,pxVar8);
              return pxVar18;
            }
            xmlAddChild(p_Var7,pxVar8);
            return pxVar18;
          }
          local_58 = pxVar8;
          local_40 = xmlDocCopyNode(pxVar8,target,2);
          if (pxVar18 == (xmlNodePtr)0x0) {
            node = local_58->parent;
            pxVar18 = local_40;
          }
          else if (local_74 == iVar13) {
            xmlAddNextSibling(p_Var7,local_40);
          }
          else {
            xmlAddChild(p_Var7,local_40);
            iVar12 = local_74;
          }
          pxVar8 = local_58;
          pxVar9 = local_70;
          if (1 < local_5c) {
            pxVar9 = (xmlDocPtr)xmlXIncludeGetNthChild(local_58,local_5c + -1);
            local_5c = 0;
          }
          if ((local_70 == (xmlDocPtr)local_50) && (1 < (int)local_68)) {
            pxVar8 = xmlXIncludeGetNthChild(pxVar8,(int)local_68 + -1);
            local_68 = 0;
          }
          else {
            pxVar8 = pxVar8->children;
          }
          local_74 = local_74 + 1;
          local_44 = 0;
          p_Var7 = local_40;
          if (pxVar8 == (xmlNodePtr)0x0) {
            return pxVar18;
          }
        } while( true );
      }
    }
  }
  else if (((xVar1 == XPATH_NODESET) &&
           (local_50 = (xmlNodePtr)obj->nodesetval, local_50 != (xmlNodePtr)0x0)) &&
          (0 < *(int *)&local_50->_private)) {
    lVar14 = 0;
    pxVar8 = (xmlNodePtr)0x0;
    pxVar18 = (xmlNodePtr)0x0;
    do {
      pxVar9 = (xmlDocPtr)(*(xmlNodePtr **)&local_50->type)[lVar14];
      pxVar6 = pxVar18;
      pxVar5 = pxVar8;
      if (pxVar9 != (xmlDocPtr)0x0) {
        xVar2 = pxVar9->type;
        elem = local_50;
        if (xVar2 < XML_XINCLUDE_END) {
          elem = (xmlNodePtr)&DAT_0007dc04;
          if ((0x7dc04U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
            if (xVar2 != XML_XINCLUDE_START) goto LAB_0019b4f0;
            for (pxVar9 = (xmlDocPtr)pxVar9->next; pxVar5 = pxVar8, pxVar9 != (xmlDocPtr)0x0;
                pxVar9 = (xmlDocPtr)pxVar9->next) {
              uVar17 = pxVar9->type - XML_TEXT_NODE;
              if ((5 < uVar17) && (pxVar9->type != XML_ELEMENT_NODE)) break;
              pxVar5 = xmlXIncludeCopyNode((xmlXIncludeCtxtPtr)local_38,local_70,pxVar9,
                                           (xmlNodePtr)(ulong)uVar17);
              pxVar18 = pxVar5;
              if (pxVar6 != (xmlNodePtr)0x0) {
                xmlAddNextSibling(pxVar6,pxVar5);
                pxVar18 = pxVar8;
              }
              pxVar8 = pxVar18;
              pxVar6 = pxVar5;
            }
          }
        }
        else {
LAB_0019b4f0:
          pxVar6 = xmlXIncludeCopyNode((xmlXIncludeCtxtPtr)local_38,local_70,pxVar9,elem);
          pxVar5 = pxVar6;
          if (pxVar18 != (xmlNodePtr)0x0) {
            xmlAddNextSibling(pxVar18,pxVar6);
            pxVar6 = pxVar18->next;
            pxVar5 = pxVar8;
            if (pxVar18->next == (xmlNodePtr)0x0) {
              pxVar6 = pxVar18;
            }
          }
        }
      }
      pxVar8 = pxVar5;
      lVar14 = lVar14 + 1;
      pxVar18 = pxVar6;
      if (*(int *)&local_50->_private <= lVar14) {
        return pxVar8;
      }
    } while( true );
  }
  return (xmlNodePtr)0x0;
}

Assistant:

static xmlNodePtr
xmlXIncludeCopyXPointer(xmlXIncludeCtxtPtr ctxt, xmlDocPtr target,
	                xmlDocPtr source, xmlXPathObjectPtr obj) {
    xmlNodePtr list = NULL, last = NULL;
    int i;

    if (source == NULL)
	source = ctxt->doc;
    if ((ctxt == NULL) || (target == NULL) || (source == NULL) ||
	(obj == NULL))
	return(NULL);
    switch (obj->type) {
        case XPATH_NODESET: {
	    xmlNodeSetPtr set = obj->nodesetval;
	    if (set == NULL)
		return(NULL);
	    for (i = 0;i < set->nodeNr;i++) {
		if (set->nodeTab[i] == NULL)
		    continue;
		switch (set->nodeTab[i]->type) {
		    case XML_TEXT_NODE:
		    case XML_CDATA_SECTION_NODE:
		    case XML_ELEMENT_NODE:
		    case XML_ENTITY_REF_NODE:
		    case XML_ENTITY_NODE:
		    case XML_PI_NODE:
		    case XML_COMMENT_NODE:
		    case XML_DOCUMENT_NODE:
		    case XML_HTML_DOCUMENT_NODE:
#ifdef LIBXML_DOCB_ENABLED
		    case XML_DOCB_DOCUMENT_NODE:
#endif
		    case XML_XINCLUDE_END:
			break;
		    case XML_XINCLUDE_START: {
	                xmlNodePtr tmp, cur = set->nodeTab[i];

			cur = cur->next;
			while (cur != NULL) {
			    switch(cur->type) {
				case XML_TEXT_NODE:
				case XML_CDATA_SECTION_NODE:
				case XML_ELEMENT_NODE:
				case XML_ENTITY_REF_NODE:
				case XML_ENTITY_NODE:
				case XML_PI_NODE:
				case XML_COMMENT_NODE:
				    tmp = xmlXIncludeCopyNode(ctxt, target,
							      source, cur);
				    if (last == NULL) {
					list = last = tmp;
				    } else {
					xmlAddNextSibling(last, tmp);
					last = tmp;
				    }
				    cur = cur->next;
				    continue;
				default:
				    break;
			    }
			    break;
			}
			continue;
		    }
		    case XML_ATTRIBUTE_NODE:
		    case XML_NAMESPACE_DECL:
		    case XML_DOCUMENT_TYPE_NODE:
		    case XML_DOCUMENT_FRAG_NODE:
		    case XML_NOTATION_NODE:
		    case XML_DTD_NODE:
		    case XML_ELEMENT_DECL:
		    case XML_ATTRIBUTE_DECL:
		    case XML_ENTITY_DECL:
			continue; /* for */
		}
		if (last == NULL)
		    list = last = xmlXIncludeCopyNode(ctxt, target, source,
			                              set->nodeTab[i]);
		else {
		    xmlAddNextSibling(last,
			    xmlXIncludeCopyNode(ctxt, target, source,
				                set->nodeTab[i]));
		    if (last->next != NULL)
			last = last->next;
		}
	    }
	    break;
	}
#ifdef LIBXML_XPTR_ENABLED
	case XPATH_LOCATIONSET: {
	    xmlLocationSetPtr set = (xmlLocationSetPtr) obj->user;
	    if (set == NULL)
		return(NULL);
	    for (i = 0;i < set->locNr;i++) {
		if (last == NULL)
		    list = last = xmlXIncludeCopyXPointer(ctxt, target, source,
			                                  set->locTab[i]);
		else
		    xmlAddNextSibling(last,
			    xmlXIncludeCopyXPointer(ctxt, target, source,
				                    set->locTab[i]));
		if (last != NULL) {
		    while (last->next != NULL)
			last = last->next;
		}
	    }
	    break;
	}
	case XPATH_RANGE:
	    return(xmlXIncludeCopyRange(ctxt, target, source, obj));
#endif
	case XPATH_POINT:
	    /* points are ignored in XInclude */
	    break;
	default:
	    break;
    }
    return(list);
}